

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O0

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::array,unsigned_long>
::
transit_state<afsm::test::json_parser_def::context::array::value,afsm::test::json_parser_def::context::array::value,afsm::test::events::comma,afsm::actions::detail::guard_check<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::array::value,afsm::test::events::comma,afsm::none>,afsm::actions::detail::action_invocation<afsm::none,afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::array::value,afsm::test::json_parser_def::context::array::value>,afsm::transitions::detail::state_exit<afsm::inner_state_machine<afsm::test::json_parser_def::context::arr___state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>>
          (state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::array,unsigned_long>
           *this,__tuple_element_t<0UL,_tuple<state<value,_inner_state_machine<array,_inner_state_machine<context,_state_machine<json_parser_def,_none,_none,_afsm::detail::observer_wrapper>_>_>_>_>_>
                 *event)

{
  event_process_result eVar1;
  undefined1 local_36 [6];
  __tuple_element_t<0UL,_tuple<state<value,_inner_state_machine<array,_inner_state_machine<context,_state_machine<json_parser_def,_none,_none,_afsm::detail::observer_wrapper>_>_>_>_>_>
  *local_30;
  __tuple_element_t<0UL,_tuple<state<value,_inner_state_machine<array,_inner_state_machine<context,_state_machine<json_parser_def,_none,_none,_afsm::detail::observer_wrapper>_>_>_>_>_>
  *target;
  __tuple_element_t<0UL,_tuple<state<value,_inner_state_machine<array,_inner_state_machine<context,_state_machine<json_parser_def,_none,_none,_afsm::detail::observer_wrapper>_>_>_>_>_>
  *source;
  comma *event_local;
  state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::test::json_parser_def::context::array,_unsigned_long>
  *this_local;
  
  source = event;
  event_local = (comma *)this;
  target = std::
           get<0ul,afsm::state<afsm::test::json_parser_def::context::array::value,afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>
                     ((tuple<afsm::state<afsm::test::json_parser_def::context::array::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>
                       *)(this + 0x10));
  local_30 = std::
             get<0ul,afsm::state<afsm::test::json_parser_def::context::array::value,afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>
                       ((tuple<afsm::state<afsm::test::json_parser_def::context::array::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>
                         *)(this + 0x10));
  eVar1 = transit_state_impl<afsm::state<afsm::test::json_parser_def::context::array::value,afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>,afsm::state<afsm::test::json_parser_def::context::array::value,afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>,afsm::test::events::comma,afsm::actions::detail::guard_check<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::array::value,afsm::test::events::comma,afsm___state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>>
                    (this,source,target,local_30,0,local_36);
  return eVar1;
}

Assistant:

actions::event_process_result
    transit_state(Event&& event, Guard guard, Action action, SourceExit exit,
            TargetEnter enter, SourceClear clear)
    {
        using source_index = ::psst::meta::index_of<SourceState, inner_states_def>;
        using target_index = ::psst::meta::index_of<TargetState, inner_states_def>;

        static_assert(source_index::found, "Failed to find source state index");
        static_assert(target_index::found, "Failed to find target state index");

        auto& source = ::std::get< source_index::value >(states_);
        auto& target = ::std::get< target_index::value >(states_);
        return transit_state_impl(
                ::std::forward<Event>(event), source, target,
                 guard, action, exit, enter, clear,
                 target_index::value,
                 typename def::traits::exception_safety<state_machine_definition_type>::type{});
    }